

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

Cof_Man_t * Cof_ManCreateLogicSimple(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Cof_Man_t *p_00;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  Cof_Obj_t *pCVar9;
  Cof_Obj_t *pCVar10;
  ulong uVar11;
  bool bVar12;
  uint local_40;
  int local_3c;
  int iHandle;
  int i;
  int *pMuxRefs;
  Gia_Obj_t *pObj;
  Cof_Obj_t *pFanLog;
  Cof_Obj_t *pObjLog;
  Cof_Man_t *p;
  Gia_Man_t *pGia_local;
  
  local_40 = 0;
  p_00 = (Cof_Man_t *)calloc(1,0x48);
  p_00->pGia = pGia;
  iVar1 = Gia_ManCiNum(pGia);
  pVVar6 = Vec_IntAlloc(iVar1);
  p_00->vCis = pVVar6;
  iVar1 = Gia_ManCoNum(pGia);
  pVVar6 = Vec_IntAlloc(iVar1);
  p_00->vCos = pVVar6;
  iVar1 = Gia_ManObjNum(pGia);
  iVar2 = Gia_ManAndNum(pGia);
  iVar3 = Gia_ManCoNum(pGia);
  p_00->nObjData = iVar1 * 6 + iVar2 * 4 + iVar3 * 2;
  piVar7 = (int *)calloc((long)p_00->nObjData,4);
  p_00->pObjData = piVar7;
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  local_3c = 0;
  while( true ) {
    bVar12 = false;
    if (local_3c < pGia->nObjs) {
      pMuxRefs = (int *)Gia_ManObj(pGia,local_3c);
      bVar12 = (Gia_Obj_t *)pMuxRefs != (Gia_Obj_t *)0x0;
    }
    if (!bVar12) break;
    pMuxRefs[2] = local_40;
    pCVar10 = Cof_ManObj(p_00,local_40);
    *(uint *)pCVar10 = *(uint *)pCVar10 & 0xffffff0f;
    iVar1 = Gia_ObjRefNum(pGia,(Gia_Obj_t *)pMuxRefs);
    *(uint *)pCVar10 = *(uint *)pCVar10 & 0xff | iVar1 << 8;
    pCVar10->Id = local_3c;
    pCVar10->Value = 0;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)pMuxRefs);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo((Gia_Obj_t *)pMuxRefs);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCi((Gia_Obj_t *)pMuxRefs);
        if (iVar1 != 0) {
          *(uint *)pCVar10 = *(uint *)pCVar10 & 0xfffffffe | 1;
          Vec_IntPush(p_00->vCis,local_40);
        }
      }
      else {
        pGVar8 = Gia_ObjFanin0((Gia_Obj_t *)pMuxRefs);
        uVar5 = Gia_ObjHandle(pGVar8);
        pCVar9 = Cof_ManObj(p_00,uVar5);
        uVar4 = Cof_ObjHandleDiff(pCVar10,pCVar9);
        uVar11 = (ulong)(*(uint *)pCVar10 >> 4 & 0xf);
        *(uint *)(&pCVar10[1].field_0x0 + uVar11 * 4) =
             *(uint *)(&pCVar10[1].field_0x0 + uVar11 * 4) & 0x80000000 | uVar4 & 0x7fffffff;
        uVar5 = pCVar9->Value;
        pCVar9->Value = uVar5 + 1;
        uVar11 = (ulong)((*(uint *)pCVar9 >> 4 & 0xf) + uVar5);
        *(uint *)(&pCVar9[1].field_0x0 + uVar11 * 4) =
             *(uint *)(&pCVar9[1].field_0x0 + uVar11 * 4) & 0x80000000 | uVar4 & 0x7fffffff;
        iVar1 = Gia_ObjFaninC0((Gia_Obj_t *)pMuxRefs);
        uVar5 = *(uint *)pCVar10 >> 4 & 0xf;
        *(uint *)pCVar10 = *(uint *)pCVar10 & 0xffffff0f | (uVar5 + 1 & 0xf) << 4;
        *(uint *)(&pCVar10[1].field_0x0 + (ulong)uVar5 * 4) =
             *(uint *)(&pCVar10[1].field_0x0 + (ulong)uVar5 * 4) & 0x7fffffff | iVar1 << 0x1f;
        *(uint *)pCVar10 = *(uint *)pCVar10 & 0xfffffffe | 1;
        Vec_IntPush(p_00->vCos,local_40);
      }
    }
    else {
      pGVar8 = Gia_ObjFanin0((Gia_Obj_t *)pMuxRefs);
      uVar5 = Gia_ObjHandle(pGVar8);
      pCVar9 = Cof_ManObj(p_00,uVar5);
      uVar4 = Cof_ObjHandleDiff(pCVar10,pCVar9);
      uVar11 = (ulong)(*(uint *)pCVar10 >> 4 & 0xf);
      *(uint *)(&pCVar10[1].field_0x0 + uVar11 * 4) =
           *(uint *)(&pCVar10[1].field_0x0 + uVar11 * 4) & 0x80000000 | uVar4 & 0x7fffffff;
      uVar5 = pCVar9->Value;
      pCVar9->Value = uVar5 + 1;
      uVar11 = (ulong)((*(uint *)pCVar9 >> 4 & 0xf) + uVar5);
      *(uint *)(&pCVar9[1].field_0x0 + uVar11 * 4) =
           *(uint *)(&pCVar9[1].field_0x0 + uVar11 * 4) & 0x80000000 | uVar4 & 0x7fffffff;
      iVar1 = Gia_ObjFaninC0((Gia_Obj_t *)pMuxRefs);
      uVar5 = *(uint *)pCVar10 >> 4 & 0xf;
      *(uint *)pCVar10 = *(uint *)pCVar10 & 0xffffff0f | (uVar5 + 1 & 0xf) << 4;
      *(uint *)(&pCVar10[1].field_0x0 + (ulong)uVar5 * 4) =
           *(uint *)(&pCVar10[1].field_0x0 + (ulong)uVar5 * 4) & 0x7fffffff | iVar1 << 0x1f;
      pGVar8 = Gia_ObjFanin1((Gia_Obj_t *)pMuxRefs);
      uVar5 = Gia_ObjHandle(pGVar8);
      pCVar9 = Cof_ManObj(p_00,uVar5);
      uVar4 = Cof_ObjHandleDiff(pCVar10,pCVar9);
      uVar11 = (ulong)(*(uint *)pCVar10 >> 4 & 0xf);
      *(uint *)(&pCVar10[1].field_0x0 + uVar11 * 4) =
           *(uint *)(&pCVar10[1].field_0x0 + uVar11 * 4) & 0x80000000 | uVar4 & 0x7fffffff;
      uVar5 = pCVar9->Value;
      pCVar9->Value = uVar5 + 1;
      uVar11 = (ulong)((*(uint *)pCVar9 >> 4 & 0xf) + uVar5);
      *(uint *)(&pCVar9[1].field_0x0 + uVar11 * 4) =
           *(uint *)(&pCVar9[1].field_0x0 + uVar11 * 4) & 0x80000000 | uVar4 & 0x7fffffff;
      iVar1 = Gia_ObjFaninC1((Gia_Obj_t *)pMuxRefs);
      uVar5 = *(uint *)pCVar10 >> 4 & 0xf;
      *(uint *)pCVar10 = *(uint *)pCVar10 & 0xffffff0f | (uVar5 + 1 & 0xf) << 4;
      *(uint *)(&pCVar10[1].field_0x0 + (ulong)uVar5 * 4) =
           *(uint *)(&pCVar10[1].field_0x0 + (ulong)uVar5 * 4) & 0x7fffffff | iVar1 << 0x1f;
      p_00->nNodes = p_00->nNodes + 1;
    }
    iVar1 = Cof_ObjSize(pCVar10);
    local_40 = iVar1 + local_40;
    p_00->nObjs = p_00->nObjs + 1;
    local_3c = local_3c + 1;
  }
  if (local_40 != p_00->nObjData) {
    __assert_fail("iHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                  ,0xb4,"Cof_Man_t *Cof_ManCreateLogicSimple(Gia_Man_t *)");
  }
  piVar7 = Gia_ManCreateMuxRefs(pGia);
  local_3c = 0;
  while( true ) {
    bVar12 = false;
    if (local_3c < pGia->nObjs) {
      pMuxRefs = (int *)Gia_ManObj(pGia,local_3c);
      bVar12 = (Gia_Obj_t *)pMuxRefs != (Gia_Obj_t *)0x0;
    }
    if (!bVar12) break;
    uVar5 = Gia_ObjHandle((Gia_Obj_t *)pMuxRefs);
    pCVar10 = Cof_ManObj(p_00,uVar5);
    if (*(uint *)pCVar10 >> 8 != pCVar10->Value) {
      __assert_fail("pObjLog->nFanouts == pObjLog->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                    ,0xb9,"Cof_Man_t *Cof_ManCreateLogicSimple(Gia_Man_t *)");
    }
    pCVar10->nFanoutsM = piVar7[local_3c];
    local_3c = local_3c + 1;
  }
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  return p_00;
}

Assistant:

Cof_Man_t * Cof_ManCreateLogicSimple( Gia_Man_t * pGia )
{
    Cof_Man_t * p;
    Cof_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj;
    int * pMuxRefs;
    int i, iHandle = 0;
    p = ABC_CALLOC( Cof_Man_t, 1 );
    p->pGia = pGia;
    p->vCis = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Cof_Obj_t) / 4) * Gia_ManObjNum(pGia) + 4 * Gia_ManAndNum(pGia) + 2 * Gia_ManCoNum(pGia);
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        pObj->Value = iHandle;
        pObjLog = Cof_ManObj( p, iHandle );
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->Id       = i;
        pObjLog->Value    = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin0(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC0(pObj);

            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin1(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC1(pObj);
            p->nNodes++;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin0(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC0(pObj);

            pObjLog->fTerm = 1;
            Vec_IntPush( p->vCos, iHandle );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObjLog->fTerm = 1;
            Vec_IntPush( p->vCis, iHandle );
        }
        iHandle += Cof_ObjSize( pObjLog );
        p->nObjs++;
    }
    assert( iHandle == p->nObjData );
    pMuxRefs = Gia_ManCreateMuxRefs( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        pObjLog = Cof_ManObj( p, Gia_ObjHandle(pObj) );
        assert( pObjLog->nFanouts == pObjLog->Value );
        pObjLog->nFanoutsM = pMuxRefs[i];
    }
    ABC_FREE( pMuxRefs );
    return p;
}